

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

RelationsMap * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getAugmentedRelated
          (RelationsMap *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,
          Bucket *start,Relations *relations,bool toFirstStrict)

{
  _Rb_tree_header *p_Var1;
  Type strictRel;
  pointer pDVar2;
  bool bVar3;
  char cVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  EdgeIterator local_170;
  Visited firstStrictEdges;
  Visited nestedVisited;
  pointer local_b8;
  iterator it_1;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header;
  firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  begin_related((iterator *)&nestedVisited,this,start,relations);
  while( true ) {
    end_related((iterator *)&it_1,this,start);
    bVar3 = operator!=((iterator *)&nestedVisited,(iterator *)&it_1);
    EdgeIterator::~EdgeIterator((iterator *)&it_1);
    if (!bVar3) break;
    it_1.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
         (bitset<12UL>)local_b8[-1].current._to._M_data;
    pmVar5 = std::
             map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)&it_1);
    std::bitset<12UL>::set(&pmVar5->bits,(ulong)local_b8[-1].current._rel,true);
    cVar4 = dg::vr::Relations::isStrict(local_b8[-1].current._rel);
    if (cVar4 == '\0') {
      EdgeIterator::operator++((iterator *)&nestedVisited);
    }
    else {
      std::
      _Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
      ::_M_emplace_unique<dg::vr::Bucket::RelationEdge_const&>
                ((_Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
                  *)&firstStrictEdges,&local_b8[-1].current);
      EdgeIterator::skipSuccessors((iterator *)&nestedVisited);
    }
  }
  EdgeIterator::~EdgeIterator((iterator *)&nestedVisited);
  nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header;
  nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nestedVisited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       nestedVisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = firstStrictEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &firstStrictEdges._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    strictRel = *(Type *)&p_Var6[1]._M_parent;
    Bucket::EdgeIterator::EdgeIterator
              (&it_1,(Bucket *)p_Var6[1]._M_left,&nestedVisited,relations,true,true);
    while( true ) {
      local_170.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
           (bitset<12UL>)(_Base_bitset<1UL>)0x0;
      local_170.undirectedOnly = false;
      local_170.relationsFocused = false;
      local_170.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170.visited._M_data =
           (set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
            *)&nestedVisited;
      bVar3 = operator!=(&it_1,&local_170);
      std::
      _Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ::~_Vector_base(&local_170.stack.
                       super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                     );
      if (!bVar3) break;
      local_170.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
           (bitset<12UL>)
           it_1.stack.
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].current._to._M_data;
      pDVar2 = it_1.stack.
               super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      pmVar5 = std::
               map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_170);
      bVar3 = processEdge(&pDVar2->current,strictRel,pmVar5,toFirstStrict,&firstStrictEdges);
      if (bVar3) {
        std::
        _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
        ::erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                 *)&nestedVisited,
                &it_1.stack.
                 super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].current);
        Bucket::EdgeIterator::skipSuccessors(&it_1);
      }
      else {
        Bucket::EdgeIterator::operator++(&it_1);
      }
    }
    std::
    _Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
    ::~_Vector_base(&it_1.stack.
                     super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                   );
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::~_Rb_tree(&nestedVisited._M_t);
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::~_Rb_tree(&firstStrictEdges._M_t);
  return __return_storage_ptr__;
}

Assistant:

RelationsMap getAugmentedRelated(const Bucket &start,
                                     const Relations &relations,
                                     bool toFirstStrict) const {
        RelationsMap result;

        Bucket::iterator::Visited firstStrictEdges;
        for (auto it = begin_related(start, relations);
             it != end_related(start);
             /*incremented in body */) {
            result[it->to()].set(it->rel());

            if (Relations::isStrict(it->rel())) {
                firstStrictEdges.emplace(*it);
                it.skipSuccessors();
            } else
                ++it;
        }

        Bucket::iterator::Visited nestedVisited;
        for (Bucket::RelationEdge edge : firstStrictEdges) {
            const Bucket &nestedStart = edge.to();
            Relations::Type strictRel = edge.rel();

            bool shouldSkip = false;
            for (auto it = nestedStart.begin(nestedVisited, relations, true,
                                             true);
                 it != nestedStart.end(nestedVisited);
                 shouldSkip ? it.skipSuccessors() : ++it) {
                shouldSkip = processEdge(*it, strictRel, result[it->to()],
                                         toFirstStrict, firstStrictEdges);
                if (shouldSkip)
                    nestedVisited.erase(*it);
            }
        }
        return result;
    }